

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O0

void ugui_graphics_draw_sprite(ugui_graphics_t *graphics,ugui_sprite_t sprite,ugui_point_t point)

{
  ugui_pixel_t local_31;
  int local_30;
  int iStack_2c;
  ugui_pixel_t pixel;
  int x;
  int y;
  ugui_graphics_t *graphics_local;
  undefined1 auStack_18 [4];
  ugui_point_t point_local;
  ugui_sprite_t sprite_local;
  
  _auStack_18 = sprite._0_8_;
  _x = graphics;
  graphics_local._4_4_ = point;
  for (iStack_2c = 0; iStack_2c < (int)(uint)(ushort)auStack_18._2_2_; iStack_2c = iStack_2c + 1) {
    for (local_30 = 0; local_30 < (int)(uint)(ushort)auStack_18._0_2_; local_30 = local_30 + 1) {
      _ugui_sprite_get_pixel
                ((ugui_sprite_t *)auStack_18,(uint16_t)local_30,(uint16_t)iStack_2c,&local_31);
      if ((local_31 & 1U) != 0) {
        plot(_x,((uint)graphics_local._4_4_ & 0xffff) + local_30,
             ((uint)graphics_local._4_4_ >> 0x10) + iStack_2c);
      }
    }
  }
  return;
}

Assistant:

void ugui_graphics_draw_sprite(ugui_graphics_t* graphics, ugui_sprite_t sprite, ugui_point_t point)
{
	for (int y = 0; y < sprite.h; y++) {
		for (int x = 0; x < sprite.w; x++) {
			ugui_pixel_t pixel;
			_ugui_sprite_get_pixel(&sprite, x, y, &pixel);
			if (pixel) {
				plot(graphics, point.x + x, point.y + y);
			}
		}
	}
}